

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          pointer pos,TypeSetter *args)

{
  ulong uVar1;
  pointer p;
  Expression *pEVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pTVar3 = (pointer)operator_new(uVar9 << 4);
  pEVar2 = (args->expr).ptr;
  *(undefined8 *)((long)pTVar3 + lVar7) = (args->type).ptr;
  ((undefined8 *)((long)pTVar3 + lVar7))[1] = pEVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)pos);
  pTVar4 = p;
  pTVar5 = pTVar3;
  if (lVar6 == 0) {
    pTVar4 = pTVar3;
    pTVar5 = p;
    if (sVar8 != 0) {
      do {
        pEVar2 = (pTVar5->expr).ptr;
        (pTVar4->type).ptr = (pTVar5->type).ptr;
        (pTVar4->expr).ptr = pEVar2;
        pTVar5 = pTVar5 + 1;
        pTVar4 = pTVar4 + 1;
      } while (pTVar5 != pos);
    }
  }
  else {
    for (; pTVar4 != pos; pTVar4 = pTVar4 + 1) {
      pEVar2 = (pTVar4->expr).ptr;
      (pTVar5->type).ptr = (pTVar4->type).ptr;
      (pTVar5->expr).ptr = pEVar2;
      pTVar5 = pTVar5 + 1;
    }
    memcpy((void *)((long)pTVar3 + lVar7 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pTVar3;
  return (pointer)((long)pTVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}